

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O2

Violation mp::ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (QuadraticConeConstraint *con,
                    VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  pointer piVar1;
  long lVar2;
  double dVar3;
  double __x;
  Violation VVar4;
  
  piVar1 = (con->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = (long)(con->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  __x = 0.0;
  while (lVar2 = lVar2 + -1, lVar2 != 0) {
    dVar3 = (con->
            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
            ).params_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2] *
            (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar1[lVar2]];
    __x = __x + dVar3 * dVar3;
  }
  if (__x < 0.0) {
    dVar3 = sqrt(__x);
  }
  else {
    dVar3 = SQRT(__x);
  }
  VVar4.viol_ = dVar3 - *(con->
                         super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                         ).params_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start *
                        (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [*(con->
                          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                          ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start];
  VVar4.valX_ = __x;
  return VVar4;
}

Assistant:

Violation ComputeViolation(
    const QuadraticConeConstraint& con, const VarVec& x) {
  const auto& args = con.GetArguments();
  const auto& params = con.GetParameters();
  assert(args.size()==params.size());
  double sum = 0.0;
  for (auto i=args.size(); --i; )
    sum += std::pow( params[i]*x[args[i]], 2.0 );
  return {std::sqrt(sum) - params[0]*x[args[0]],
        sum};
}